

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O1

float __thiscall sf::Font::getUnderlinePosition(Font *this,uint characterSize)

{
  void *pvVar1;
  bool bVar2;
  long lVar3;
  float fVar4;
  
  pvVar1 = this->m_face;
  fVar4 = 0.0;
  if (pvVar1 != (void *)0x0) {
    bVar2 = setCurrentSize(this,characterSize);
    fVar4 = 0.0;
    if (bVar2) {
      if ((*(byte *)((long)pvVar1 + 0x10) & 1) == 0) {
        fVar4 = (float)characterSize / 10.0;
      }
      else {
        lVar3 = FT_MulFix((long)*(short *)((long)pvVar1 + 0x94),
                          *(undefined8 *)(*(long *)((long)pvVar1 + 0xa0) + 0x28));
        fVar4 = (float)lVar3 * -0.015625;
      }
    }
  }
  return fVar4;
}

Assistant:

float Font::getUnderlinePosition(unsigned int characterSize) const
{
    FT_Face face = static_cast<FT_Face>(m_face);

    if (face && setCurrentSize(characterSize))
    {
        // Return a fixed position if font is a bitmap font
        if (!FT_IS_SCALABLE(face))
            return characterSize / 10.f;

        return -static_cast<float>(FT_MulFix(face->underline_position, face->size->metrics.y_scale)) / static_cast<float>(1 << 6);
    }
    else
    {
        return 0.f;
    }
}